

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_dc_predictor_64x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint8_t uVar4;
  int iVar5;
  uint8_t *puVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  
  auVar8 = in_ZMM0._0_16_;
  dc_sum_64(above);
  auVar3 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*(undefined1 (*) [32])left);
  auVar1 = vpaddq_avx(auVar3._16_16_,auVar3._0_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddw_avx(auVar1,auVar8);
  auVar1 = vpaddw_avx(auVar1,auVar2);
  uVar4 = (uint8_t)((auVar1._0_4_ + 0x30U & 0xffff) / 0x60);
  puVar6 = dst + 0x20;
  iVar5 = 0x20;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    puVar6[-0x20] = uVar4;
    puVar6[-0x1f] = uVar4;
    puVar6[-0x1e] = uVar4;
    puVar6[-0x1d] = uVar4;
    puVar6[-0x1c] = uVar4;
    puVar6[-0x1b] = uVar4;
    puVar6[-0x1a] = uVar4;
    puVar6[-0x19] = uVar4;
    puVar6[-0x18] = uVar4;
    puVar6[-0x17] = uVar4;
    puVar6[-0x16] = uVar4;
    puVar6[-0x15] = uVar4;
    puVar6[-0x14] = uVar4;
    puVar6[-0x13] = uVar4;
    puVar6[-0x12] = uVar4;
    puVar6[-0x11] = uVar4;
    puVar6[-0x10] = uVar4;
    puVar6[-0xf] = uVar4;
    puVar6[-0xe] = uVar4;
    puVar6[-0xd] = uVar4;
    puVar6[-0xc] = uVar4;
    puVar6[-0xb] = uVar4;
    puVar6[-10] = uVar4;
    puVar6[-9] = uVar4;
    puVar6[-8] = uVar4;
    puVar6[-7] = uVar4;
    puVar6[-6] = uVar4;
    puVar6[-5] = uVar4;
    puVar6[-4] = uVar4;
    puVar6[-3] = uVar4;
    puVar6[-2] = uVar4;
    puVar6[-1] = uVar4;
    *puVar6 = uVar4;
    puVar6[1] = uVar4;
    puVar6[2] = uVar4;
    puVar6[3] = uVar4;
    puVar6[4] = uVar4;
    puVar6[5] = uVar4;
    puVar6[6] = uVar4;
    puVar6[7] = uVar4;
    puVar6[8] = uVar4;
    puVar6[9] = uVar4;
    puVar6[10] = uVar4;
    puVar6[0xb] = uVar4;
    puVar6[0xc] = uVar4;
    puVar6[0xd] = uVar4;
    puVar6[0xe] = uVar4;
    puVar6[0xf] = uVar4;
    puVar6[0x10] = uVar4;
    puVar6[0x11] = uVar4;
    puVar6[0x12] = uVar4;
    puVar6[0x13] = uVar4;
    puVar6[0x14] = uVar4;
    puVar6[0x15] = uVar4;
    puVar6[0x16] = uVar4;
    puVar6[0x17] = uVar4;
    puVar6[0x18] = uVar4;
    puVar6[0x19] = uVar4;
    puVar6[0x1a] = uVar4;
    puVar6[0x1b] = uVar4;
    puVar6[0x1c] = uVar4;
    puVar6[0x1d] = uVar4;
    puVar6[0x1e] = uVar4;
    puVar6[0x1f] = uVar4;
    puVar6 = puVar6 + stride;
  }
  return;
}

Assistant:

void aom_dc_predictor_64x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m256i sum_above = dc_sum_64(above);
  __m256i sum_left = dc_sum_32(left);
  sum_left = _mm256_add_epi16(sum_left, sum_above);
  uint16_t sum = (uint16_t)_mm_cvtsi128_si32(_mm256_castsi256_si128(sum_left));
  sum += 48;
  sum /= 96;
  const __m256i row = _mm256_set1_epi8((int8_t)sum);
  row_store_64xh(&row, 32, dst, stride);
}